

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::FboTestUtil::FlatColorShader::shadeFragments
          (FlatColorShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  pointer pUVar1;
  GenericVec4 *pGVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  int fragNdx;
  int iVar7;
  int iVar8;
  Vec4 color;
  UVec4 uicolor;
  IVec4 icolor;
  Vec4 local_58;
  deUint32 local_40;
  deUint32 local_3c;
  deUint32 local_38;
  deUint32 local_34;
  deUint32 local_30;
  deUint32 local_2c;
  deUint32 local_28;
  deUint32 local_24;
  
  pUVar1 = (this->super_ShaderProgram).m_uniforms.
           super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_58.m_data._0_8_ = *(undefined8 *)&pUVar1->value;
  local_58.m_data._8_8_ = *(undefined8 *)((long)&pUVar1->value + 8);
  castVectorSaturate<int>(&local_58);
  castVectorSaturate<unsigned_int>(&local_58);
  iVar3 = *(int *)&(this->super_ShaderProgram).field_0x154;
  if (iVar3 == 4) {
    if (0 < numPackets) {
      pGVar2 = context->outputArray;
      iVar3 = context->numFragmentOutputs;
      iVar5 = 0;
      uVar4 = 0;
      do {
        lVar6 = 4;
        iVar7 = iVar5;
        do {
          pGVar2[iVar7].v.uData[0] = (deUint32)local_58.m_data[0];
          pGVar2[iVar7].v.uData[1] = (deUint32)local_58.m_data[1];
          pGVar2[iVar7].v.uData[2] = (deUint32)local_58.m_data[2];
          pGVar2[iVar7].v.uData[3] = (deUint32)local_58.m_data[3];
          iVar7 = iVar7 + iVar3;
          lVar6 = lVar6 + -1;
        } while (lVar6 != 0);
        uVar4 = uVar4 + 1;
        iVar5 = iVar5 + iVar3 * 4;
      } while (uVar4 != (uint)numPackets);
    }
  }
  else if (iVar3 == 0x1e) {
    if (0 < numPackets) {
      pGVar2 = context->outputArray;
      iVar3 = 0;
      iVar5 = 0;
      do {
        iVar7 = 0;
        do {
          iVar8 = (iVar3 + iVar7) * context->numFragmentOutputs;
          pGVar2[iVar8].v.uData[0] = local_30;
          pGVar2[iVar8].v.uData[1] = local_2c;
          pGVar2[iVar8].v.uData[2] = local_28;
          pGVar2[iVar8].v.uData[3] = local_24;
          iVar7 = iVar7 + 1;
        } while (iVar7 != 4);
        iVar5 = iVar5 + 1;
        iVar3 = iVar3 + 4;
      } while (iVar5 != numPackets);
    }
  }
  else if ((iVar3 == 0x22) && (0 < numPackets)) {
    pGVar2 = context->outputArray;
    iVar3 = 0;
    iVar5 = 0;
    do {
      iVar7 = 0;
      do {
        iVar8 = (iVar3 + iVar7) * context->numFragmentOutputs;
        pGVar2[iVar8].v.uData[0] = local_40;
        pGVar2[iVar8].v.uData[1] = local_3c;
        pGVar2[iVar8].v.uData[2] = local_38;
        pGVar2[iVar8].v.uData[3] = local_34;
        iVar7 = iVar7 + 1;
      } while (iVar7 != 4);
      iVar5 = iVar5 + 1;
      iVar3 = iVar3 + 4;
    } while (iVar5 != numPackets);
  }
  return;
}

Assistant:

void FlatColorShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const tcu::Vec4		color	(m_uniforms[0].value.f4);
	const tcu::IVec4	icolor	= castVectorSaturate<deInt32>(color);
	const tcu::UVec4	uicolor	= castVectorSaturate<deUint32>(color);

	DE_UNREF(packets);

	if (m_outputType == glu::TYPE_FLOAT_VEC4)
	{
		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
	}
	else if (m_outputType == glu::TYPE_INT_VEC4)
	{
		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, icolor);
	}
	else if (m_outputType == glu::TYPE_UINT_VEC4)
	{
		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, uicolor);
	}
	else
		DE_ASSERT(DE_FALSE);
}